

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O2

uint64_t __thiscall
kj::parse::_::ParseInteger<10U>::operator()(ParseInteger<10U> *this,char first,Array<char> *digits)

{
  byte bVar1;
  char cVar2;
  uint64_t uVar3;
  Array<char> *__range3;
  size_t sVar4;
  
  cVar2 = ((byte)first < 0x61) * ' ' + -0x57;
  if (first < 'A') {
    cVar2 = -0x30;
  }
  uVar3 = (uint64_t)(char)(cVar2 + first);
  for (sVar4 = 0; digits->size_ != sVar4; sVar4 = sVar4 + 1) {
    bVar1 = digits->ptr[sVar4];
    cVar2 = (bVar1 < 0x61) * ' ' + -0x57;
    if ((char)bVar1 < 'A') {
      cVar2 = -0x30;
    }
    uVar3 = (long)(char)(cVar2 + bVar1) + uVar3 * 10;
  }
  return uVar3;
}

Assistant:

inline char parseDigit(char c) {
  if (c < 'A') return c - '0';
  if (c < 'a') return c - 'A' + 10;
  return c - 'a' + 10;
}